

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stat_mgr.cxx
# Opt level: O2

void __thiscall
nuraft::stat_mgr::get_all_stats
          (stat_mgr *this,
          vector<nuraft::stat_elem_*,_std::allocator<nuraft::stat_elem_*>_> *stats_out)

{
  _Rb_tree_node_base *p_Var1;
  long lVar2;
  unique_lock<std::mutex> l;
  unique_lock<std::mutex> uStack_28;
  
  std::unique_lock<std::mutex>::unique_lock(&uStack_28,&this->stat_map_lock_);
  std::vector<nuraft::stat_elem_*,_std::allocator<nuraft::stat_elem_*>_>::resize
            (stats_out,(this->stat_map_)._M_t._M_impl.super__Rb_tree_header._M_node_count);
  p_Var1 = (this->stat_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  lVar2 = 0;
  while ((_Rb_tree_header *)p_Var1 != &(this->stat_map_)._M_t._M_impl.super__Rb_tree_header) {
    *(undefined8 *)(*(long *)stats_out + lVar2) = *(undefined8 *)(p_Var1 + 2);
    p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1);
    lVar2 = lVar2 + 8;
  }
  std::unique_lock<std::mutex>::~unique_lock(&uStack_28);
  return;
}

Assistant:

void stat_mgr::get_all_stats(std::vector<stat_elem*>& stats_out) {
    std::unique_lock<std::mutex> l(stat_map_lock_);
    stats_out.resize(stat_map_.size());
    size_t idx = 0;
    for (auto& entry: stat_map_) {
        stats_out[idx++] = entry.second;
    }
}